

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChGaussIntegrationRule.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChGaussIntegrationRule::SetIntOnSquare
          (ChGaussIntegrationRule *this,int nPoints,
          vector<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
          *GpVector)

{
  double dVar1;
  double dVar2;
  ChGaussPoint *pCVar3;
  ChLog *this_00;
  ChStreamOutAscii *this_01;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  vector<double,_std::allocator<double>_> w;
  vector<double,_std::allocator<double>_> c;
  ChVector<double> coord;
  vector<double,_std::allocator<double>_> local_98;
  vector<double,_std::allocator<double>_> local_78;
  ChVector<double> local_58;
  long local_38;
  
  local_58.m_data[0] = 0.0;
  local_58.m_data[1] = 0.0;
  local_58.m_data[2] = 0.0;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>::resize
            (GpVector,(long)nPoints);
  if (nPoints < 9) {
    if (nPoints == 1) {
      local_58.m_data[0] = 0.0;
      local_58.m_data[1] = 0.0;
      pCVar3 = (ChGaussPoint *)::operator_new(0xa0);
      ChGaussPoint::ChGaussPoint(pCVar3,1,&local_58,4.0);
      *(GpVector->
       super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
       )._M_impl.super__Vector_impl_data._M_start = pCVar3;
      goto LAB_0061523f;
    }
    if (nPoints == 4) {
      std::vector<double,_std::allocator<double>_>::resize(&local_78,2);
      std::vector<double,_std::allocator<double>_>::resize(&local_98,2);
      *local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = -0.577350269189626;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[1] = 0.577350269189626;
      *local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = 1.0;
      local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[1] = 1.0;
      iVar5 = 1;
      lVar6 = 0;
      lVar4 = 0;
      do {
        lVar7 = 0;
        do {
          local_58.m_data[0] =
               local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar4];
          local_58.m_data[1] =
               local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar7];
          dVar1 = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar4];
          dVar2 = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar7];
          pCVar3 = (ChGaussPoint *)::operator_new(0xa0);
          ChGaussPoint::ChGaussPoint(pCVar3,iVar5 + (int)lVar7,&local_58,dVar2 * dVar1);
          *(ChGaussPoint **)
           ((long)(GpVector->
                  super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
                  )._M_impl.super__Vector_impl_data._M_start + lVar7 * 8 + lVar6) = pCVar3;
          lVar7 = lVar7 + 1;
        } while (lVar7 == 1);
        iVar5 = iVar5 + 2;
        lVar6 = lVar6 + 0x10;
        bVar8 = lVar4 == 0;
        lVar4 = lVar4 + 1;
      } while (bVar8);
      goto LAB_0061523f;
    }
  }
  else {
    if (nPoints == 9) {
      std::vector<double,_std::allocator<double>_>::resize(&local_78,3);
      std::vector<double,_std::allocator<double>_>::resize(&local_98,3);
      *local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = -0.774596669241483;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[1] = 0.0;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[2] = 0.774596669241483;
      *local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = 0.555555555555555;
      local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[1] = 0.888888888888888;
      local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[2] = 0.555555555555555;
      lVar4 = 0;
      lVar6 = 0;
      do {
        lVar7 = 0;
        local_38 = lVar4;
        do {
          local_58.m_data[0] =
               local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar6];
          local_58.m_data[1] =
               local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar7];
          dVar1 = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar6];
          dVar2 = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar7];
          pCVar3 = (ChGaussPoint *)::operator_new(0xa0);
          ChGaussPoint::ChGaussPoint(pCVar3,(int)lVar4 + 1,&local_58,dVar2 * dVar1);
          (GpVector->
          super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
          )._M_impl.super__Vector_impl_data._M_start[lVar4] = pCVar3;
          lVar7 = lVar7 + 1;
          lVar4 = lVar4 + 1;
        } while (lVar7 != 3);
        lVar6 = lVar6 + 1;
        lVar4 = local_38 + 3;
      } while (lVar6 != 3);
      goto LAB_0061523f;
    }
    if (nPoints == 0x10) {
      std::vector<double,_std::allocator<double>_>::resize(&local_78,4);
      std::vector<double,_std::allocator<double>_>::resize(&local_98,4);
      *local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = -0.861136311594053;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[1] = -0.339981043584856;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[2] = 0.339981043584856;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[3] = 0.861136311594053;
      *local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = 0.347854845137454;
      local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[1] = 0.652145154862546;
      local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[2] = 0.652145154862546;
      local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[3] = 0.347854845137454;
      iVar5 = 1;
      lVar6 = 0;
      lVar4 = 0;
      do {
        lVar7 = 0;
        do {
          local_58.m_data[0] =
               local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar4];
          local_58.m_data[1] =
               local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar7];
          dVar1 = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar4];
          dVar2 = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar7];
          pCVar3 = (ChGaussPoint *)::operator_new(0xa0);
          ChGaussPoint::ChGaussPoint(pCVar3,iVar5 + (int)lVar7,&local_58,dVar2 * dVar1);
          *(ChGaussPoint **)
           ((long)(GpVector->
                  super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
                  )._M_impl.super__Vector_impl_data._M_start + lVar7 * 8 + lVar6) = pCVar3;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        lVar4 = lVar4 + 1;
        iVar5 = iVar5 + 4;
        lVar6 = lVar6 + 0x20;
      } while (lVar4 != 4);
      goto LAB_0061523f;
    }
  }
  this_00 = GetLog();
  this_01 = ChStreamOutAscii::operator<<
                      (&this_00->super_ChStreamOutAscii,
                       "SetIntOnCube: unsupported number of integration points: ");
  ChStreamOutAscii::operator<<(this_01,nPoints);
LAB_0061523f:
  if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ChGaussIntegrationRule::SetIntOnSquare(int nPoints, std::vector<ChGaussPoint*>* GpVector) {
    int i, j;
    double weight;
    ChVector<> coord;
    std::vector<double> c, w;

    // Resize the vector containing Gauss Points
    // GpVector = new std::vector<ChGaussPoint> [ nPoints ];
    (*GpVector).resize(nPoints);

    switch (nPoints) {
        case 1:

            coord.x() = 0.0;
            coord.y() = 0.0;
            weight = 4.0;
            (*GpVector)[0] = new ChGaussPoint(1, &coord, weight);
            break;

        case 4:

            c.resize(2);
            w.resize(2);
            c[0] = -0.577350269189626;
            c[1] = 0.577350269189626;

            w[0] = 1.0;
            w[1] = 1.0;

            for (i = 0; i < 2; i++) {
                for (j = 0; j < 2; j++) {
                    coord.x() = c[i];
                    coord.y() = c[j];
                    weight = w[i] * w[j];
                    // ChGaussPoint* my_gp = new ChGaussPoint( 4 *i + 2 *j + k , &coord, weight);
                    (*GpVector)[2 * i + j] = new ChGaussPoint(2 * i + j + 1, &coord, weight);
                }
            }

            break;

        case 9:

            c.resize(3);
            w.resize(3);
            c[0] = -0.774596669241483;
            c[1] = 0.0;
            c[2] = 0.774596669241483;

            w[0] = 0.555555555555555;
            w[1] = 0.888888888888888;
            w[2] = 0.555555555555555;

            for (i = 0; i < 3; i++) {
                for (j = 0; j < 3; j++) {
                    coord.x() = c[i];
                    coord.y() = c[j];
                    weight = w[i] * w[j];
                    (*GpVector)[3 * i + j] = new ChGaussPoint(3 * i + j + 1, &coord, weight);
                }
            }

            break;

        case 16:

            c.resize(4);
            w.resize(4);
            c[0] = -0.861136311594053;
            c[1] = -0.339981043584856;
            c[2] = 0.339981043584856;
            c[3] = 0.861136311594053;

            w[0] = 0.347854845137454;
            w[1] = 0.652145154862546;
            w[2] = 0.652145154862546;
            w[3] = 0.347854845137454;

            for (i = 0; i < 4; i++) {
                for (j = 0; j < 4; j++) {
                    coord.x() = c[i];
                    coord.y() = c[j];
                    weight = w[i] * w[j];
                    (*GpVector)[4 * i + j] = new ChGaussPoint(4 * i + j + 1, &coord, weight);
                }
            }

            break;

        default:
            GetLog() << "SetIntOnCube: unsupported number of integration points: " << nPoints;

    }  //__end of Switch
}